

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

ControlTypes __thiscall QLayout::controlTypes(QLayout *this)

{
  int iVar1;
  QFlags<QSizePolicy::ControlType> other;
  long *plVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  ControlTypes types;
  ControlType in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c;
  QFlagsStorage<QSizePolicy::ControlType> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*in_RDI + 200))();
  if (iVar1 == 0) {
    QFlags<QSizePolicy::ControlType>::QFlags
              ((QFlags<QSizePolicy::ControlType> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  }
  else {
    local_c.i = 0xaaaaaaaa;
    QFlags<QSizePolicy::ControlType>::QFlags((QFlags<QSizePolicy::ControlType> *)0x33ccf8);
    local_1c = (**(code **)(*in_RDI + 200))();
    while (local_1c = local_1c + -1, -1 < local_1c) {
      plVar2 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_1c);
      other.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
      super_QFlagsStorage<QSizePolicy::ControlType>.i =
           (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)(**(code **)(*plVar2 + 0x80))();
      QFlags<QSizePolicy::ControlType>::operator|=
                ((QFlags<QSizePolicy::ControlType> *)&local_c,other);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
         (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)local_c.i;
}

Assistant:

QSizePolicy::ControlTypes QLayout::controlTypes() const
{
    if (count() == 0)
        return QSizePolicy::DefaultType;
    QSizePolicy::ControlTypes types;
    for (int i = count() - 1; i >= 0; --i)
        types |= itemAt(i)->controlTypes();
    return types;
}